

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezePdu.cpp
# Opt level: O0

bool __thiscall DIS::StopFreezePdu::operator==(StopFreezePdu *this,StopFreezePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  StopFreezePdu *rhs_local;
  StopFreezePdu *this_local;
  
  local_19 = SimulationManagementFamilyPdu::operator==
                       (&this->super_SimulationManagementFamilyPdu,
                        &rhs->super_SimulationManagementFamilyPdu);
  bVar1 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_reason != rhs->_reason) {
    local_19 = false;
  }
  if (this->_frozenBehavior != rhs->_frozenBehavior) {
    local_19 = false;
  }
  if (this->_padding1 != rhs->_padding1) {
    local_19 = false;
  }
  if (this->_requestID != rhs->_requestID) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool StopFreezePdu::operator ==(const StopFreezePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_realWorldTime == rhs._realWorldTime) ) ivarsEqual = false;
     if( ! (_reason == rhs._reason) ) ivarsEqual = false;
     if( ! (_frozenBehavior == rhs._frozenBehavior) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }